

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctr_drbg.c
# Opt level: O2

int ctr_drbg_update_internal(mbedtls_ctr_drbg_context *ctx,uchar *data)

{
  uchar *puVar1;
  int iVar2;
  long lVar3;
  uchar *output;
  uint uVar4;
  uchar tmp [48];
  
  output = tmp;
  tmp[0x20] = '\0';
  tmp[0x21] = '\0';
  tmp[0x22] = '\0';
  tmp[0x23] = '\0';
  tmp[0x24] = '\0';
  tmp[0x25] = '\0';
  tmp[0x26] = '\0';
  tmp[0x27] = '\0';
  tmp[0x28] = '\0';
  tmp[0x29] = '\0';
  tmp[0x2a] = '\0';
  tmp[0x2b] = '\0';
  tmp[0x2c] = '\0';
  tmp[0x2d] = '\0';
  tmp[0x2e] = '\0';
  tmp[0x2f] = '\0';
  tmp[0x10] = '\0';
  tmp[0x11] = '\0';
  tmp[0x12] = '\0';
  tmp[0x13] = '\0';
  tmp[0x14] = '\0';
  tmp[0x15] = '\0';
  tmp[0x16] = '\0';
  tmp[0x17] = '\0';
  tmp[0x18] = '\0';
  tmp[0x19] = '\0';
  tmp[0x1a] = '\0';
  tmp[0x1b] = '\0';
  tmp[0x1c] = '\0';
  tmp[0x1d] = '\0';
  tmp[0x1e] = '\0';
  tmp[0x1f] = '\0';
  tmp[0] = '\0';
  tmp[1] = '\0';
  tmp[2] = '\0';
  tmp[3] = '\0';
  tmp[4] = '\0';
  tmp[5] = '\0';
  tmp[6] = '\0';
  tmp[7] = '\0';
  tmp[8] = '\0';
  tmp[9] = '\0';
  tmp[10] = '\0';
  tmp[0xb] = '\0';
  tmp[0xc] = '\0';
  tmp[0xd] = '\0';
  tmp[0xe] = '\0';
  tmp[0xf] = '\0';
  uVar4 = 0;
  do {
    if (0x2f < uVar4) {
      for (lVar3 = 0; lVar3 != 0x30; lVar3 = lVar3 + 1) {
        tmp[lVar3] = tmp[lVar3] ^ data[lVar3];
      }
      iVar2 = mbedtls_aes_setkey_enc(&ctx->aes_ctx,tmp,0x100);
      if (iVar2 == 0) {
        *(undefined8 *)ctx->counter = tmp._32_8_;
        *(undefined8 *)(ctx->counter + 8) = tmp._40_8_;
        iVar2 = 0;
      }
      return iVar2;
    }
    lVar3 = 0xf;
    do {
      if (lVar3 == -1) break;
      puVar1 = ctx->counter + lVar3;
      *puVar1 = *puVar1 + '\x01';
      lVar3 = lVar3 + -1;
    } while (*puVar1 == '\0');
    iVar2 = mbedtls_aes_crypt_ecb(&ctx->aes_ctx,1,ctx->counter,output);
    if (iVar2 != 0) {
      return iVar2;
    }
    output = output + 0x10;
    uVar4 = uVar4 + 0x10;
  } while( true );
}

Assistant:

static int ctr_drbg_update_internal( mbedtls_ctr_drbg_context *ctx,
                              const unsigned char data[MBEDTLS_CTR_DRBG_SEEDLEN] )
{
    unsigned char tmp[MBEDTLS_CTR_DRBG_SEEDLEN];
    unsigned char *p = tmp;
    int i, j;
    int ret = 0;

    memset( tmp, 0, MBEDTLS_CTR_DRBG_SEEDLEN );

    for( j = 0; j < MBEDTLS_CTR_DRBG_SEEDLEN; j += MBEDTLS_CTR_DRBG_BLOCKSIZE )
    {
        /*
         * Increase counter
         */
        for( i = MBEDTLS_CTR_DRBG_BLOCKSIZE; i > 0; i-- )
            if( ++ctx->counter[i - 1] != 0 )
                break;

        /*
         * Crypt counter block
         */
        if( ( ret = mbedtls_aes_crypt_ecb( &ctx->aes_ctx, MBEDTLS_AES_ENCRYPT, ctx->counter, p ) ) != 0 )
        {
            return( ret );
        }

        p += MBEDTLS_CTR_DRBG_BLOCKSIZE;
    }

    for( i = 0; i < MBEDTLS_CTR_DRBG_SEEDLEN; i++ )
        tmp[i] ^= data[i];

    /*
     * Update key and counter
     */
    if( ( ret = mbedtls_aes_setkey_enc( &ctx->aes_ctx, tmp, MBEDTLS_CTR_DRBG_KEYBITS ) ) != 0 )
    {
        return( ret );
    }
    memcpy( ctx->counter, tmp + MBEDTLS_CTR_DRBG_KEYSIZE, MBEDTLS_CTR_DRBG_BLOCKSIZE );

    return( 0 );
}